

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void test_br(void)

{
  element_type *target;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> zero;
  shared_ptr<vmips::VirtReg> r4;
  shared_ptr<vmips::VirtReg> r0;
  shared_ptr<vmips::CFGNode> c;
  shared_ptr<vmips::VirtReg> val;
  shared_ptr<vmips::VirtReg> r1;
  shared_ptr<vmips::VirtReg> ret;
  shared_ptr<vmips::VirtReg> r3;
  shared_ptr<vmips::VirtReg> r2;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br1;
  shared_ptr<vmips::VirtReg> mm;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br2;
  __shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2> local_190;
  shared_ptr<vmips::VirtReg> local_180;
  shared_ptr<vmips::VirtReg> local_170;
  shared_ptr<vmips::VirtReg> local_160;
  undefined4 local_150 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  undefined4 local_140 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  shared_ptr<vmips::VirtReg> local_130;
  shared_ptr<vmips::VirtReg> local_120;
  shared_ptr<vmips::VirtReg> local_110;
  Function local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> local_f0;
  __weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2> local_d0 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Function local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> local_b0;
  Function local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  Function local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Function local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Function local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Function local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Function local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
  std::make_shared<vmips::Function,char_const(&)[5],int>((char (*) [5])&local_190,(int *)"test");
  vmips::Function::entry();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  vmips::get_special((SpecialReg)&local_180);
  local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_160,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180
            );
  local_f0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_130,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180
            );
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (&local_f0,local_190._M_ptr,&local_160,&local_130);
  local_b0.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_100,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180);
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (&local_b0,local_190._M_ptr,&local_180,&local_180);
  local_150[0] = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_30,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_28);
  vmips::Function::switch_to(local_190._M_ptr);
  local_150[0] = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_40,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  vmips::Function::join((shared_ptr *)local_150,local_190._M_ptr);
  vmips::Function::switch_to(local_190._M_ptr);
  local_170.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_110,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_180
            );
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_170,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_110);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_c0,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_160);
  vmips::Function::join(local_50,local_190._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  vmips::Function::add_phi(local_190._M_ptr,local_100);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_60,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  local_140[0] = 4;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            (local_70,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,(int *)&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_80,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_140,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_130);
  target = local_190._M_ptr;
  std::__weak_ptr<vmips::Function,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<vmips::Function,void>
            (local_d0,&local_190);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_120,(weak_ptr<vmips::Function> *)target,
             (shared_ptr<vmips::VirtReg> *)local_d0);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_c8);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_90,(shared_ptr<vmips::VirtReg> *)local_190._M_ptr,&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  vmips::Function::output((ostream *)local_190._M_ptr);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::color();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output((ostream *)local_190._M_ptr);
  vmips::Function::scan_overlap();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output((ostream *)local_190._M_ptr);
  vmips::Function::handle_alloca();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  vmips::Function::output((ostream *)local_190._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_170.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_130.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_160.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_180.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  return;
}

Assistant:

void test_br() {
    auto f  = std::make_shared<Function>("test", 2);
    f->entry();
    auto zero = get_special(SpecialReg::zero);;
    auto r0 = f->append<addi>(zero, 1);
    auto r1 = f->append<addi>(zero, 1);
    auto br1 = f->branch<beq>(r0, r1);

    //branch 1
    auto r2 = f->append<addi>(zero, 1);
    auto br2 = f->branch<beq>(zero, zero);

    //branch 11
    f->append<addi>(zero, 1);

    //branch 12
    f->switch_to(br2.second);
    f->append<addi>(zero, 1);

    auto c = f->join(br2.first, br2.second);

    //branch 2
    f->switch_to(br1.second);
    auto r3 = f->append<addi>(zero, 2);
    auto r4 = f->append<add>(r3, r3);
    auto mm = f->append<add>(r0, r0);

    f->join(c, br1.second);
    f->add_phi(r2, r4);
    f->append<add>(r4, r4);
    f->append<addi>(r4, 4);
    f->append<add>(r4, r0);
    auto val = f->append<add>(r1, r0);
    auto ret = f->call(f, val);
    f->append<add>(ret, ret);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    std::cout << std::endl;
    f->output(std::cout);
    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);
    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}